

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O3

void extent_hook_pre_reentrancy(tsdn_t *tsdn,arena_t *arena)

{
  char *in_FS_OFFSET;
  
  if ((tsdn == (tsdn_t *)0x0) && (tsdn = *(tsdn_t **)in_FS_OFFSET, *in_FS_OFFSET != '\0')) {
    tsdn = (tsdn_t *)tsd_fetch_slow(&tsdn->tsd,false);
  }
  (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
       (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
  if ((tsdn->tsd).state.repr != '\0') {
    return;
  }
  tsd_slow_update(&tsdn->tsd);
  return;
}

Assistant:

static void
extent_hook_pre_reentrancy(tsdn_t *tsdn, arena_t *arena) {
	tsd_t *tsd = tsdn_null(tsdn) ? tsd_fetch() : tsdn_tsd(tsdn);
	if (arena == arena_get(tsd_tsdn(tsd), 0, false)) {
		/*
		 * The only legitimate case of customized extent hooks for a0 is
		 * hooks with no allocation activities.  One such example is to
		 * place metadata on pre-allocated resources such as huge pages.
		 * In that case, rely on reentrancy_level checks to catch
		 * infinite recursions.
		 */
		pre_reentrancy(tsd, NULL);
	} else {
		pre_reentrancy(tsd, arena);
	}
}